

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O2

void mpifft1d_dif(int *dim,int *pdim,int ndim,int current_dim,int *pidx,int inverse,int size,
                 int *embed,cpx_t *in,cpx_t *out,plan_t plan_short,plan_t plan_long,int *rho_L,
                 int *rho_pk0,int *rho_Lk0,int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,
                 int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  double dVar1;
  double dVar2;
  cpx_t cVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  cpx_t *pcVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  float *pfVar13;
  ulong uVar14;
  bool bVar15;
  float fVar16;
  cpx_t *local_90;
  double theta;
  
  uVar5 = pdim[current_dim];
  uVar14 = (long)dim[current_dim] / (long)(int)uVar5;
  uVar6 = uVar14 & 0xffffffff;
  uVar4 = size / embed[current_dim];
  iVar11 = (int)uVar14;
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)uVar4) {
    uVar10 = (ulong)uVar4;
  }
  if (0 < iVar11) {
    uVar7 = uVar14 & 0xffffffff;
  }
  local_90 = in;
  for (; 1 < (int)uVar5; uVar5 = (int)uVar5 / iVar11) {
    for (lVar12 = 0; uVar10 * 8 != lVar12; lVar12 = lVar12 + 8) {
      dfft_local_1dfft((cpx_t *)((long)&in->x + lVar12),(cpx_t *)((long)&out->x + lVar12),plan_long,
                       inverse);
    }
    iVar9 = pidx[current_dim];
    pcVar8 = in;
    pfVar13 = &out->y;
    for (uVar14 = 0; uVar14 != uVar7; uVar14 = uVar14 + 1) {
      dVar1 = (double)(int)uVar14 *
              ((((double)(iVar9 % (int)uVar5) / (double)(int)uVar5) * -6.283185307179586) /
              (double)iVar11);
      dVar2 = cos(dVar1);
      dVar1 = sin(dVar1);
      fVar16 = (float)dVar1;
      if (inverse != 0) {
        fVar16 = -fVar16;
      }
      for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
        cVar3.y = pfVar13[uVar6 * 2 + -1] * fVar16 + (float)dVar2 * pfVar13[uVar6 * 2];
        cVar3.x = pfVar13[uVar6 * 2 + -1] * (float)dVar2 + -pfVar13[uVar6 * 2] * fVar16;
        pcVar8[uVar6] = cVar3;
      }
      pfVar13 = pfVar13 + (long)(int)uVar4 * 2;
      pcVar8 = pcVar8 + (int)uVar4;
    }
    iVar9 = 1;
    uVar6 = (ulong)uVar5;
    if (iVar11 < (int)uVar5) {
      iVar9 = (int)uVar5 / iVar11;
    }
    dfft_redistribute_cyclic_to_block_1d
              (dim,pdim,ndim,current_dim,uVar5,iVar9,pidx,1,size,embed,in,out,rho_L,rho_pk0,
               dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,comm,proc_map,row_m);
  }
  uVar5 = (int)(uVar4 * iVar11) / (int)uVar6;
  uVar14 = 0;
  if (0 < (int)uVar5) {
    uVar14 = (ulong)uVar5;
  }
  while (bVar15 = uVar14 != 0, uVar14 = uVar14 - 1, bVar15) {
    dfft_local_1dfft(local_90,out,plan_short,inverse);
    out = out + 1;
    local_90 = local_90 + 1;
  }
  return;
}

Assistant:

void mpifft1d_dif(int *dim,
            int *pdim,
            int ndim,
            int current_dim,
            int* pidx,
            int inverse,
            int size,
            int *embed,
            cpx_t *in,
            cpx_t *out,
            plan_t plan_short,
            plan_t plan_long,
            int *rho_L,
            int *rho_pk0,
            int *rho_Lk0,
            int *dfft_nsend,
            int *dfft_nrecv,
            int *dfft_offset_send,
            int *dfft_offset_recv,
            MPI_Comm comm,
            int *proc_map,
            int row_m)
    {
    int p = pdim[current_dim];
    int length = dim[current_dim]/pdim[current_dim];
    int st = size/embed[current_dim]*(dim[current_dim]/pdim[current_dim]);

    /* compute stride for column major matrix storage */
    int stride = size/embed[current_dim];

    int c;
    int k0 = length;
    for (c = p; c >1; c /= length)
        {
#if 1
        /* do local out-of-place place FFT (long-distance butterflies) */
        #ifdef FFT1D_SUPPORTS_THREADS
        dfft_local_1dfft(in, out, plan_long, inverse);
        #else
        int i;
        #pragma omp parallel for
        for (i = 0; i < st/length; ++i)
            dfft_local_1dfft(in+i, out+i, plan_long, inverse);
        #endif
        /* apply twiddle factors */
        double alpha = ((double)(pidx[current_dim] %c))/(double)c;
        int j;
        #pragma omp parallel for private(j)
        for (j = 0; j < length; j++)
            {
            double theta = -(double)2.0 * (double)M_PI * alpha/(double) length;
            cpx_t w;
            RE(w) = cos((double)j*theta);
            IM(w) = sin((double)j*theta);

            double sign = ((inverse) ? (-1.0) : 1.0);
            IM(w) *=sign;

            int r;
            for (r = 0; r < stride; ++r)
                {
                cpx_t x = out[j*stride+r];
                cpx_t y;
                RE(y) = RE(x) * RE(w) - IM(x) * IM(w);
                IM(y) = RE(x) * IM(w) + IM(x) * RE(w);

                in[j*stride+r] = y;
                }
            }
        int rev = 1;
#else
        int rev = 0;
#endif

        /* in-place redistribute from group-cyclic c -> c1 */
        int c1 = ((c > length) ? (c/length) : 1);
        k0 = c;
        dfft_redistribute_cyclic_to_block_1d(dim,pdim,ndim,current_dim, c, c1,
            pidx, rev, size, embed, in,out,rho_L,rho_pk0,
            dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,
            comm, proc_map, row_m);
        }

    /* perform remaining short-distance butterflies,
     * out-of-place 1d FFT */
    #ifdef FFT1D_SUPPORTS_THREADS
    dfft_local_1dfft(in, out, plan_short,inverse);
    #else
    int i;
    #pragma omp parallel for
    for (i = 0; i < st/k0; ++i)
        dfft_local_1dfft(in+i, out+i, plan_short, inverse);
    #endif
    }